

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O1

URL * __thiscall
miniros::master::AddressResolver::resolveAddressFor
          (URL *__return_storage_ptr__,AddressResolver *this,
          shared_ptr<miniros::master::NodeRef> *node,NetAddress *remoteAddress,
          NetAddress *localAddress)

{
  _Atomic_word *p_Var1;
  int iVar2;
  NodeRef *this_00;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  long *plVar5;
  element_type *peVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar8;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  pthread_mutex_t *local_78;
  shared_ptr<miniros::master::HostInfo> requesterHost;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Alloc_hider local_40;
  
  this_00 = (node->super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (this_00 == (NodeRef *)0x0) {
    network::URL::URL(__return_storage_ptr__);
  }
  else {
    NodeRef::getUrl(__return_storage_ptr__,this_00);
    local_78 = (pthread_mutex_t *)&this->m_mutex;
    iVar3 = pthread_mutex_lock(local_78);
    if (iVar3 != 0) {
      ::std::__throw_system_error(iVar3);
    }
    if (this->m_resolveIp != false) {
      NodeRef::hostInfo((NodeRef *)local_98);
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar3 = *(_Atomic_word *)(local_98._8_8_ + 8);
        do {
          if (iVar3 == 0) {
            this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            break;
          }
          LOCK();
          iVar2 = *(_Atomic_word *)(local_98._8_8_ + 8);
          bVar8 = iVar3 == iVar2;
          if (bVar8) {
            *(_Atomic_word *)(local_98._8_8_ + 8) = iVar3 + 1;
            iVar2 = iVar3;
          }
          iVar3 = iVar2;
          UNLOCK();
        } while (!bVar8);
      }
      if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar8 = true;
      }
      else {
        bVar8 = this_01->_M_use_count == 0;
      }
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_98._0_8_;
      if (bVar8) {
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)(local_98._8_8_ + 0xc);
          iVar3 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar3 = *(_Atomic_word *)(local_98._8_8_ + 0xc);
          *(int *)(local_98._8_8_ + 0xc) = iVar3 + -1;
        }
        if (iVar3 == 1) {
          (*(*(_func_int ***)local_98._8_8_)[3])();
        }
      }
      if (paVar7 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (resolveAddressFor::loc.initialized_ == false) {
          local_50._M_allocated_capacity = (size_type)(pointer)&stack0xffffffffffffffc0;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"miniros.unknown_package","");
          plVar5 = (long *)::std::__cxx11::string::append(local_50._M_local_buf);
          peVar6 = (element_type *)(plVar5 + 2);
          if ((element_type *)*plVar5 == peVar6) {
            local_60._M_allocated_capacity = (size_type)(peVar6->hostname)._M_dataplus._M_p;
            local_60._8_8_ = plVar5[3];
            requesterHost.super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)&local_60;
          }
          else {
            local_60._M_allocated_capacity = (size_type)(peVar6->hostname)._M_dataplus._M_p;
            requesterHost.super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)*plVar5;
          }
          requesterHost.super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
          *plVar5 = (long)peVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)::std::__cxx11::string::append((char *)&requesterHost);
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 == paVar7) {
            local_88._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_88._8_8_ = plVar5[3];
            local_98._0_8_ = &local_88;
          }
          else {
            local_88._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_98._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar5;
          }
          local_98._8_8_ = plVar5[1];
          *plVar5 = (long)paVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          console::initializeLogLocation(&resolveAddressFor::loc,(string *)local_98,Warn);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._0_8_ != &local_88) {
            operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)requesterHost.
                 super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_60) {
            operator_delete(requesterHost.
                            super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,(ulong)(local_60._M_allocated_capacity + 1));
          }
          if ((pointer)local_50._M_allocated_capacity != (pointer)&stack0xffffffffffffffc0) {
            operator_delete((void *)local_50._M_allocated_capacity,(ulong)(local_40._M_p + 1));
          }
        }
        if (resolveAddressFor::loc.level_ != Warn) {
          console::setLogLocationLevel(&resolveAddressFor::loc,Warn);
          console::checkLogLocationEnabled(&resolveAddressFor::loc);
        }
        if (resolveAddressFor::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,resolveAddressFor::loc.logger_,
                         resolveAddressFor::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                         ,0x98,
                         "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const network::NetAddress &, const network::NetAddress &) const"
                         ,"No HostInfo for node %s",
                         (((node->
                           super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>)
                          ._M_ptr)->m_id)._M_dataplus._M_p);
        }
      }
      else {
        findHost((AddressResolver *)&requesterHost,(NetAddress *)this);
        if ((requesterHost.super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr == (element_type *)0x0) ||
           (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)requesterHost.
                         super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)) {
          if (paVar7->_M_local_buf[0x50] == '\x01') {
            ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
          }
          else if (*(long *)(paVar7->_M_local_buf + 0x48) != 0) {
            p_Var4 = *(_Rb_tree_node_base **)(paVar7->_M_local_buf + 0x38);
            if (p_Var4 != (_Rb_tree_node_base *)(paVar7->_M_local_buf + 0x28)) {
              do {
                bVar8 = network::NetAddress::isLocal((NetAddress *)(p_Var4 + 1));
                if (!bVar8) {
                  network::NetAddress::str_abi_cxx11_((string *)local_98,(NetAddress *)(p_Var4 + 1))
                  ;
                  ::std::__cxx11::string::operator=
                            ((string *)__return_storage_ptr__,(string *)local_98);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_98._0_8_ != &local_88) {
                    operator_delete((void *)local_98._0_8_,
                                    (ulong)(local_88._M_allocated_capacity + 1));
                  }
                  if (!bVar8) break;
                }
                p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var4);
              } while (p_Var4 != (_Rb_tree_node_base *)(paVar7->_M_local_buf + 0x28));
            }
          }
        }
        if (requesterHost.super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (requesterHost.
                     super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
    }
    pthread_mutex_unlock(local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

network::URL AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef>& node,
  const network::NetAddress& remoteAddress,
  const network::NetAddress& localAddress) const
{
  assert(node);
  if (!node)
    return {};

  network::URL url = node->getUrl();

  std::scoped_lock lock(m_mutex);
  if (!m_resolveIp)
    return url;

  auto nodeHost = node->hostInfo().lock();
  if (!nodeHost) {
    MINIROS_WARN_NAMED("resolver", "No HostInfo for node %s", node->id().c_str());
    return url;
  }

  auto requesterHost = findHost(remoteAddress);
  if (requesterHost && nodeHost == requesterHost) {
    // Both requester and node are on the same host. No additional resolution is needed.
    return url;
  }

  if (nodeHost->local) {
    // Node located on this host. We can use localAddress as a good IP for a requester.
    url.host = localAddress.address;
    return url;
  }

  // Here both node and requester are located on different machines and node is not located on a local host.
  if (!nodeHost->addresses.empty()) {
    // Find first usable address.
    for (const auto& addr: nodeHost->addresses) {
      if (!addr.isLocal()) {
        url.host = addr.str();
        break;
      }
    }
  }
  return url;
}